

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O3

DisasJumpType op_vstm(DisasContext_conflict13 *s,DisasOps *o)

{
  byte bVar1;
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 pTVar2;
  DisasJumpType DVar3;
  uint uVar4;
  TCGv_i64 dst;
  long lVar5;
  byte reg;
  ulong uVar6;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGv_i64 local_40;
  TCGTemp *local_38;
  
  uVar4 = (s->fields).presentO;
  if (((uVar4 >> 0x18 & 1) != 0) && ((uVar4 >> 0x16 & 1) != 0)) {
    bVar1 = (byte)(s->fields).c[2];
    uVar6 = (ulong)(uint)(s->fields).c[0];
    if (((uint)bVar1 < (uint)(uVar6 & 0xff)) ||
       (lVar5 = (ulong)bVar1 - (uVar6 & 0xff), 0xf < (int)lVar5)) {
      gen_program_exception(s,6);
      DVar3 = DISAS_NORETURN;
    }
    else {
      tcg_ctx = s->uc->tcg_ctx;
      dst = tcg_const_i64_s390x(tcg_ctx,lVar5 * 0x10 + 0x10);
      local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
      local_40 = o->addr1 + (long)tcg_ctx;
      local_38 = (TCGTemp *)(dst + (long)tcg_ctx);
      tcg_gen_callN_s390x(tcg_ctx,helper_probe_write_access,(TCGTemp *)0x0,3,&local_48);
      while( true ) {
        reg = (byte)uVar6;
        read_vec_element_i64(tcg_ctx,dst,reg,'\0',MO_64);
        pTVar2 = o->addr1;
        uVar4 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
        tcg_gen_qemu_st_i64_s390x(tcg_ctx,dst,pTVar2,(ulong)uVar4,MO_BEQ);
        gen_addi_and_wrap_i64(s,o->addr1,o->addr1,8);
        read_vec_element_i64(tcg_ctx,dst,reg,'\x01',MO_64);
        pTVar2 = o->addr1;
        uVar4 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
        tcg_gen_qemu_st_i64_s390x(tcg_ctx,dst,pTVar2,(ulong)uVar4,MO_BEQ);
        if (bVar1 == reg) break;
        gen_addi_and_wrap_i64(s,o->addr1,o->addr1,8);
        uVar6 = (ulong)(byte)(reg + 1);
      }
      tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(dst + (long)tcg_ctx));
      DVar3 = DISAS_NEXT;
    }
    return DVar3;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vstm(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const uint8_t v3 = get_field(s, v3);
    uint8_t v1 = get_field(s, v1);
    TCGv_i64 tmp;

    while (v3 < v1 || (v3 - v1 + 1) > 16) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    /* Probe write access before actually modifying memory */
    tmp = tcg_const_i64(tcg_ctx, (v3 - v1 + 1) * 16);
    gen_helper_probe_write_access(tcg_ctx, tcg_ctx->cpu_env, o->addr1, tmp);

    for (;; v1++) {
        read_vec_element_i64(tcg_ctx, tmp, v1, 0, ES_64);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TEQ);
        gen_addi_and_wrap_i64(s, o->addr1, o->addr1, 8);
        read_vec_element_i64(tcg_ctx, tmp, v1, 1, ES_64);
        tcg_gen_qemu_st_i64(tcg_ctx, tmp, o->addr1, get_mem_index(s), MO_TEQ);
        if (v1 == v3) {
            break;
        }
        gen_addi_and_wrap_i64(s, o->addr1, o->addr1, 8);
    }
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}